

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O2

t_int * threshold_tilde_perform(t_int *w)

{
  long lVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  
  lVar3 = w[2];
  if (*(float *)(lVar3 + 0x58) <= 0.0) {
    if (*(int *)(lVar3 + 0x4c) == 0) {
      lVar4 = 0;
      do {
        if ((int)w[3] == (int)lVar4) goto LAB_00118adb;
        lVar1 = lVar4 * 4;
        lVar4 = lVar4 + 1;
      } while (*(float *)(w[1] + lVar1) < *(float *)(lVar3 + 0x50));
      clock_delay(*(_clock **)(lVar3 + 0x40),0.0);
      *(undefined4 *)(lVar3 + 0x4c) = 1;
      fVar5 = *(float *)(lVar3 + 0x60);
    }
    else {
      lVar4 = 0;
      do {
        if ((int)w[3] == (int)lVar4) goto LAB_00118adb;
        pfVar2 = (float *)(w[1] + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (*(float *)(lVar3 + 0x54) < *pfVar2 || *(float *)(lVar3 + 0x54) == *pfVar2);
      clock_delay(*(_clock **)(lVar3 + 0x40),0.0);
      *(undefined4 *)(lVar3 + 0x4c) = 0;
      fVar5 = *(float *)(lVar3 + 100);
    }
  }
  else {
    fVar5 = *(float *)(lVar3 + 0x58) - *(float *)(lVar3 + 0x5c);
  }
  *(float *)(lVar3 + 0x58) = fVar5;
LAB_00118adb:
  return w + 4;
}

Assistant:

static t_int *threshold_tilde_perform(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_threshold_tilde *x = (t_threshold_tilde *)(w[2]);
    int n = (int)w[3];
    if (x->x_deadwait > 0)
        x->x_deadwait -= x->x_msecpertick;
    else if (x->x_state)
    {
            /* we're high; look for low sample */
        for (; n--; in1++)
        {
            if (*in1 < x->x_lothresh)
            {
                clock_delay(x->x_clock, 0L);
                x->x_state = 0;
                x->x_deadwait = x->x_lodeadtime;
                goto done;
            }
        }
    }
    else
    {
            /* we're low; look for high sample */
        for (; n--; in1++)
        {
            if (*in1 >= x->x_hithresh)
            {
                clock_delay(x->x_clock, 0L);
                x->x_state = 1;
                x->x_deadwait = x->x_hideadtime;
                goto done;
            }
        }
    }
done:
    return (w+4);
}